

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

uint8_t keyscan_all(tgestate_t *state)

{
  byte bVar1;
  uint16_t uVar2;
  ulong uVar3;
  
  uVar3 = 0xfefe;
  do {
    uVar2 = (uint16_t)uVar3;
    bVar1 = (*state->speccy->in)(state->speccy,uVar2);
    if ((bVar1 & 0x1f) != 0x1f) {
      bVar1 = bVar1 & 0x1f ^ 0x1f;
      goto LAB_00108248;
    }
    uVar3 = (ulong)((uint)uVar3 & 0xff | (uint)(uVar3 >> 7) & 0x100 | ((uint)uVar3 & 0xffffff80) * 2
                   );
  } while ((short)uVar2 < 0);
  bVar1 = 0;
LAB_00108248:
  gamedelay(state,70000);
  return bVar1;
}

Assistant:

uint8_t keyscan_all(tgestate_t *state)
{
  uint16_t port;  /* was BC */
  uint8_t  keys;  /* was A */
  int      carry = 0;

  assert(state != NULL);

  /* Scan all keyboard ports (0xFEFE .. 0x7FFE). */
  port = port_KEYBOARD_SHIFTZXCV;
  do
  {
    keys = state->speccy->in(state->speccy, port);

    /* Invert bits and mask off key bits. */
    keys = ~keys & 0x1F;
    if (keys)
      goto exit; /* Key(s) pressed */

    /* Rotate the top byte of the port number to get the next port. */
    // Conv: Was RLC B
    carry = (port >> 15) != 0;
    port  = ((port << 1) & 0xFF00) | (carry << 8) | (port & 0x00FF);
  }
  while (carry);

  keys = 0; /* No keys pressed */

exit:

  /* Conv: Timing: The original game keyscans as fast as it can. We can't
   * have that so instead we introduce a short delay and handle game thread
   * termination. */
  gamedelay(state, 3500000 / 50); /* 50/sec */

  return keys;
}